

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_set_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,size_t nb1,size_t nb2,size_t nb3,
             size_t offset,_Bool inplace)

{
  ggml_tensor *tensor;
  int64_t iVar1;
  ggml_tensor *params_00;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ulong in_stack_00000008;
  int32_t params [5];
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  tensor = (ggml_tensor *)ggml_nelements(in_RSI);
  iVar1 = ggml_nelements(in_RDX);
  if ((long)tensor < iVar1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xb3e,"GGML_ASSERT(%s) failed","ggml_nelements(a) >= ggml_nelements(b)");
  }
  if (((byte)params[0] & 1) == 0) {
    params_00 = ggml_dup_tensor((ggml_context *)tensor,in_stack_ffffffffffffff98);
  }
  else {
    params_00 = ggml_view_tensor((ggml_context *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 (ggml_tensor *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (0x3fffffff < in_stack_00000008) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xb43,"GGML_ASSERT(%s) failed","offset < (size_t)(1 << 30)");
  }
  ggml_set_op_params(tensor,params_00,0x14d4f9);
  params_00->op = GGML_OP_SET;
  params_00->src[0] = in_RSI;
  params_00->src[1] = in_RDX;
  return params_00;
}

Assistant:

static struct ggml_tensor * ggml_set_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        size_t                nb1,
        size_t                nb2,
        size_t                nb3,
        size_t                offset,
        bool                  inplace) {
    GGML_ASSERT(ggml_nelements(a) >= ggml_nelements(b));

    // make a view of the destination
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    GGML_ASSERT(offset < (size_t)(1 << 30));
    int32_t params[] = { nb1, nb2, nb3, offset, inplace ? 1 : 0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_SET;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}